

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VBufPack(N_Vector x,sunindextype local_length,int myid)

{
  int iVar1;
  void *__ptr;
  uint in_EDX;
  long in_RSI;
  N_Vector in_RDI;
  sunrealtype *buf;
  sunindextype size;
  sunindextype i;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  int flag;
  size_t local_50;
  long local_48;
  double local_40;
  double local_38;
  double local_30;
  int local_24;
  uint local_20;
  uint local_1c;
  long local_18;
  N_Vector local_10;
  int local_4;
  
  local_20 = 0;
  local_24 = 0;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = N_VBufSize(in_RDI,&local_50);
  if (local_20 == 0) {
    __ptr = malloc(local_50);
    if (__ptr == (void *)0x0) {
      printf(">>> FAILED test -- malloc failed, Proc %d \n",(ulong)local_1c);
      local_4 = 1;
    }
    else {
      for (local_48 = 0; local_48 < local_18; local_48 = local_48 + 1) {
        *(undefined8 *)((long)__ptr + local_48 * 8) = 0;
      }
      N_VConst(0x3ff0000000000000,local_10);
      local_30 = get_time();
      local_20 = N_VBufPack(local_10,__ptr);
      sync_device(local_10);
      local_38 = get_time();
      if (local_20 == 0) {
        for (local_48 = 0; local_48 < local_18; local_48 = local_48 + 1) {
          iVar1 = SUNRCompare(*(undefined8 *)((long)__ptr + local_48 * 8),0x3ff0000000000000);
          local_24 = iVar1 + local_24;
        }
        if (local_24 == 0) {
          if (local_1c == 0) {
            printf("PASSED test -- N_VBufPack\n");
          }
          local_40 = max_time(local_10,local_38 - local_30);
          if (print_time != 0) {
            printf("%s Time: %22.15e\n\n",local_40,"N_VBufPack");
          }
          free(__ptr);
          local_4 = 0;
        }
        else {
          free(__ptr);
          printf(">>> FAILED test -- N_VBufPack failed, Proc %d \n",(ulong)local_1c);
          local_4 = 1;
        }
      }
      else {
        free(__ptr);
        printf(">>> FAILED test -- N_VBufPack returned %d, Proc %d \n",(ulong)local_20,
               (ulong)local_1c);
        local_4 = 1;
      }
    }
  }
  else {
    printf(">>> FAILED test -- N_VBufSize returned %d, Proc %d \n",(ulong)local_20,(ulong)local_1c);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_N_VBufPack(N_Vector x, sunindextype local_length, int myid)
{
  int flag = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunindextype i, size;
  sunrealtype* buf;

  /* get buffer size */
  flag = N_VBufSize(x, &size);
  if (flag != 0)
  {
    printf(">>> FAILED test -- N_VBufSize returned %d, Proc %d \n", flag, myid);
    return (1);
  }

  /* create and initialize buffer */
  buf = NULL;
  buf = (sunrealtype*)malloc((size_t)size);
  if (buf == NULL)
  {
    printf(">>> FAILED test -- malloc failed, Proc %d \n", myid);
    return (1);
  }

  for (i = 0; i < local_length; i++) { buf[i] = ZERO; }

  /* set vector data */
  N_VConst(ONE, x);

  /* fill buffer */
  start_time = get_time();
  flag       = N_VBufPack(x, (void*)buf);
  sync_device(x);
  stop_time = get_time();

  if (flag != 0)
  {
    free(buf);
    printf(">>> FAILED test -- N_VBufPack returned %d, Proc %d \n", flag, myid);
    return (1);
  }

  /* check buffer values */
  for (i = 0; i < local_length; i++) { failure += SUNRCompare(buf[i], ONE); }

  if (failure)
  {
    free(buf);
    printf(">>> FAILED test -- N_VBufPack failed, Proc %d \n", myid);
    return (1);
  }
  else if (myid == 0) { printf("PASSED test -- N_VBufPack\n"); }

  /* find max time across all processes */
  maxt = max_time(x, stop_time - start_time);
  PRINT_TIME("N_VBufPack", maxt);

  /* free buffer */
  free(buf);

  return (0);
}